

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  int iVar1;
  byte *pbVar2;
  stbi_uc *psVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  ulong uVar10;
  ushort uVar11;
  uint uVar12;
  long lVar13;
  stbi_uc *psVar14;
  stbi_uc sVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long in_FS_OFFSET;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte abStack_9e9 [258];
  stbi_uc asStack_8e7 [211];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_00157010:
    a->num_bits = 0;
    a->code_buffer = 0;
    do {
      if (a->num_bits < 1) {
        stbi__fill_bits(a);
      }
      iVar8 = a->num_bits;
      uVar5 = a->code_buffer;
      a->code_buffer = uVar5 >> 1;
      a->num_bits = iVar8 + -1;
      if (iVar8 < 3) {
        stbi__fill_bits(a);
      }
      iVar8 = a->num_bits;
      uVar12 = a->code_buffer;
      a->code_buffer = uVar12 >> 2;
      a->num_bits = iVar8 - 2U;
      iVar20 = 0;
      switch(uVar12 & 3) {
      case 0:
        uVar12 = iVar8 - 2U & 7;
        if (uVar12 != 0) {
          if (iVar8 < 2) {
            stbi__fill_bits(a);
          }
          a->code_buffer = a->code_buffer >> (sbyte)uVar12;
          a->num_bits = a->num_bits - uVar12;
        }
        iVar8 = a->num_bits;
        if (iVar8 < 1) {
          uVar10 = 0;
        }
        else {
          uVar12 = a->code_buffer;
          uVar10 = 0;
          iVar20 = iVar8;
          do {
            *(char *)((long)local_814.fast + uVar10) = (char)uVar12;
            uVar10 = uVar10 + 1;
            uVar12 = uVar12 >> 8;
            iVar8 = iVar20 + -8;
            bVar4 = 8 < iVar20;
            iVar20 = iVar8;
          } while (bVar4);
          a->code_buffer = uVar12;
          a->num_bits = iVar8;
        }
        if (iVar8 != 0) {
          __assert_fail("a->num_bits == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/src/render/buffer/../stb_image.h"
                        ,0x1095,"int stbi__parse_uncompressed_block(stbi__zbuf *)");
        }
        if ((uint)uVar10 < 4) {
          psVar14 = a->zbuffer;
          psVar3 = a->zbuffer_end;
          uVar10 = uVar10 & 0xffffffff;
          do {
            if (psVar14 < psVar3) {
              a->zbuffer = psVar14 + 1;
              sVar15 = *psVar14;
              psVar14 = psVar14 + 1;
            }
            else {
              sVar15 = '\0';
            }
            *(stbi_uc *)((long)local_814.fast + uVar10) = sVar15;
            uVar10 = uVar10 + 1;
          } while (uVar10 != 4);
        }
        if ((local_814.fast[1] ^ local_814.fast[0]) == 0xffff) {
          uVar10 = (ulong)local_814.fast[0];
          if (a->zbuffer + uVar10 <= a->zbuffer_end) {
            if ((a->zout + uVar10 <= a->zout_end) ||
               (iVar8 = stbi__zexpand(a,a->zout,(uint)local_814.fast[0]), iVar8 != 0)) {
              memcpy(a->zout,a->zbuffer,uVar10);
              a->zbuffer = a->zbuffer + uVar10;
              a->zout = a->zout + uVar10;
              goto LAB_001578c0;
            }
            goto LAB_001578fd;
          }
          pcVar9 = "read past buffer";
        }
        else {
          pcVar9 = "zlib corrupt";
        }
        goto LAB_001578f4;
      case 1:
        iVar8 = stbi__zbuild_huffman
                          (&a->z_length,
                           "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                           ,0x120);
        if (iVar8 == 0) {
          return 0;
        }
        iVar8 = stbi__zbuild_huffman
                          (&a->z_distance,
                           "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                           ,0x20);
        uVar12 = uVar5;
        break;
      case 2:
        if (iVar8 < 7) {
          stbi__fill_bits(a);
        }
        iVar8 = a->num_bits;
        uVar12 = a->code_buffer;
        a->code_buffer = uVar12 >> 5;
        a->num_bits = iVar8 + -5;
        if (iVar8 < 10) {
          stbi__fill_bits(a);
        }
        iVar8 = a->num_bits;
        uVar19 = a->code_buffer;
        a->code_buffer = uVar19 >> 5;
        a->num_bits = iVar8 + -5;
        if (iVar8 < 9) {
          stbi__fill_bits(a);
        }
        uVar12 = uVar12 & 0x1f;
        iVar8 = uVar12 + 0x101;
        iVar20 = (uVar19 & 0x1f) + 1;
        uVar19 = a->code_buffer;
        a->code_buffer = uVar19 >> 4;
        a->num_bits = a->num_bits + -4;
        local_a08 = 0;
        uStack_a00 = 0;
        uStack_9f9 = 0;
        lVar22 = 0;
        do {
          if (a->num_bits < 3) {
            stbi__fill_bits(a);
          }
          uVar7 = a->code_buffer;
          a->code_buffer = uVar7 >> 3;
          a->num_bits = a->num_bits + -3;
          *(byte *)((long)&local_a08 +
                   (ulong)(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[lVar22]
                   ) = (byte)uVar7 & 7;
          lVar22 = lVar22 + 1;
        } while ((ulong)(uVar19 & 0xf) + 4 != lVar22);
        iVar6 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
        if (iVar6 == 0) goto LAB_001578fd;
        iVar6 = iVar20 + iVar8;
        iVar21 = 0;
        while( true ) {
          if (iVar6 <= iVar21) break;
          if (a->num_bits < 0x10) {
            stbi__fill_bits(a);
          }
          uVar19 = a->code_buffer;
          uVar11 = local_814.fast[uVar19 & 0x1ff];
          if (uVar11 == 0) {
            uVar11 = (ushort)uVar19 << 8 | (ushort)uVar19 >> 8;
            uVar7 = (uVar11 & 0xf0f) << 4 | (uVar11 & 0xf0f0) >> 4;
            uVar7 = (uVar7 >> 2 & 0x3333) + (uVar7 & 0x3333) * 4;
            uVar7 = (uVar7 >> 1 & 0x5555) + (uVar7 & 0x5555) * 2;
            lVar22 = 0;
            do {
              lVar13 = lVar22;
              lVar22 = lVar13 + 1;
            } while (local_814.maxcode[lVar13 + 10] <= (int)uVar7);
            uVar16 = 0xffffffff;
            if (lVar22 != 7) {
              lVar17 = (ulong)local_814.firstsymbol[lVar13 + 10] +
                       ((ulong)(uVar7 >> (7U - (char)lVar22 & 0x1f)) -
                       (ulong)local_814.firstcode[lVar13 + 10]);
              if ((ulong)*(byte *)((long)&local_814 + lVar17 + 0x484) - 9 != lVar22)
              goto LAB_00157920;
              a->code_buffer = uVar19 >> ((char)lVar13 + 10U & 0x1f);
              a->num_bits = (a->num_bits - (int)lVar22) + -9;
              uVar16 = (uint)*(ushort *)((long)&local_814 + lVar17 * 2 + 0x5a4);
            }
          }
          else {
            a->code_buffer = uVar19 >> ((byte)(uVar11 >> 9) & 0x1f);
            a->num_bits = a->num_bits - (uint)(uVar11 >> 9);
            uVar16 = uVar11 & 0x1ff;
          }
          if (uVar16 < 0x13) {
            if ((int)uVar16 < 0x10) {
              lVar22 = (long)iVar21;
              iVar21 = iVar21 + 1;
              abStack_9e9[lVar22 + 1] = (char)uVar16;
              bVar4 = true;
            }
            else {
              iVar1 = a->num_bits;
              if (uVar16 != 0x11) {
                if (uVar16 != 0x10) {
                  if (iVar1 < 7) {
                    stbi__fill_bits(a);
                  }
                  uVar19 = a->code_buffer;
                  a->code_buffer = uVar19 >> 7;
                  a->num_bits = a->num_bits + -7;
                  uVar19 = (uVar19 & 0x7f) + 0xb;
                  goto LAB_001573de;
                }
                if (iVar1 < 2) {
                  stbi__fill_bits(a);
                }
                uVar19 = a->code_buffer;
                a->code_buffer = uVar19 >> 2;
                a->num_bits = a->num_bits + -2;
                if (iVar21 != 0) {
                  uVar19 = (uVar19 & 3) + 3;
                  uVar7 = (uint)abStack_9e9[iVar21];
                  goto LAB_001573e0;
                }
                *(char **)(in_FS_OFFSET + -0x10) = "bad codelengths";
                iVar21 = 0;
                goto LAB_0015732a;
              }
              if (iVar1 < 3) {
                stbi__fill_bits(a);
              }
              uVar19 = a->code_buffer;
              a->code_buffer = uVar19 >> 3;
              a->num_bits = a->num_bits + -3;
              uVar19 = (uVar19 & 7) + 3;
LAB_001573de:
              uVar7 = 0;
LAB_001573e0:
              if (iVar6 - iVar21 < (int)uVar19) goto LAB_00157321;
              memset(abStack_9e9 + (long)iVar21 + 1,uVar7,(ulong)uVar19);
              iVar21 = iVar21 + uVar19;
              bVar4 = true;
            }
          }
          else {
LAB_00157321:
            *(char **)(in_FS_OFFSET + -0x10) = "bad codelengths";
LAB_0015732a:
            bVar4 = false;
          }
          if (!bVar4) goto LAB_001578fd;
        }
        if (iVar6 != iVar21) {
          *(char **)(in_FS_OFFSET + -0x10) = "bad codelengths";
          goto LAB_001578fd;
        }
        iVar8 = stbi__zbuild_huffman(&a->z_length,(stbi_uc *)((long)abStack_9e9 + 1),iVar8);
        if (iVar8 == 0) goto LAB_001578fd;
        iVar8 = stbi__zbuild_huffman(&a->z_distance,asStack_8e7 + uVar12,iVar20);
        uVar12 = 0;
        break;
      case 3:
        goto switchD_0015708c_caseD_3;
      }
      if (iVar8 == 0) goto LAB_001578fd;
      pcVar9 = a->zout;
      do {
        if (a->num_bits < 0x10) {
          stbi__fill_bits(a);
        }
        uVar19 = a->code_buffer;
        uVar11 = (a->z_length).fast[uVar19 & 0x1ff];
        if (uVar11 == 0) {
          uVar11 = (ushort)uVar19 << 8 | (ushort)uVar19 >> 8;
          uVar7 = (uVar11 & 0xf0f) << 4 | (uVar11 & 0xf0f0) >> 4;
          uVar7 = (uVar7 >> 2 & 0x3333) + (uVar7 & 0x3333) * 4;
          uVar7 = (uVar7 >> 1 & 0x5555) + (uVar7 & 0x5555) * 2;
          lVar22 = 0;
          do {
            lVar13 = lVar22;
            lVar22 = lVar13 + 1;
          } while ((a->z_length).maxcode[lVar13 + 10] <= (int)uVar7);
          uVar16 = 0xffffffff;
          if (lVar22 != 7) {
            lVar17 = (ulong)(a->z_length).firstsymbol[lVar13 + 10] +
                     ((ulong)(uVar7 >> (7U - (char)lVar22 & 0x1f)) -
                     (ulong)(a->z_length).firstcode[lVar13 + 10]);
            if ((ulong)*(byte *)((long)a + lVar17 + 0x4b8) - 9 != lVar22) {
LAB_00157920:
              __assert_fail("z->size[b] == s",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/src/render/buffer/../stb_image.h"
                            ,0xff8,
                            "int stbi__zhuffman_decode_slowpath(stbi__zbuf *, stbi__zhuffman *)");
            }
            a->code_buffer = uVar19 >> ((char)lVar13 + 10U & 0x1f);
            a->num_bits = (a->num_bits - (int)lVar22) + -9;
            uVar16 = (uint)*(ushort *)((long)a + lVar17 * 2 + 0x5d8);
          }
        }
        else {
          a->code_buffer = uVar19 >> ((byte)(uVar11 >> 9) & 0x1f);
          a->num_bits = a->num_bits - (uint)(uVar11 >> 9);
          uVar16 = uVar11 & 0x1ff;
        }
        if ((int)uVar16 < 0x100) {
          if ((int)uVar16 < 0) {
LAB_0015776b:
            *(char **)(in_FS_OFFSET + -0x10) = "bad huffman code";
LAB_0015777b:
            bVar4 = false;
            uVar12 = 0;
          }
          else {
            if (a->zout_end <= pcVar9) {
              iVar8 = stbi__zexpand(a,pcVar9,1);
              if (iVar8 == 0) goto LAB_0015777b;
              pcVar9 = a->zout;
            }
            *pcVar9 = (char)uVar16;
            pcVar9 = pcVar9 + 1;
            bVar4 = true;
          }
        }
        else if (uVar16 == 0x100) {
          a->zout = pcVar9;
          uVar12 = 1;
          bVar4 = false;
        }
        else {
          uVar10 = (ulong)(uVar16 - 0x101);
          uVar19 = stbi__zlength_base[uVar10];
          if (0xffffffffffffffeb < uVar10 - 0x1c) {
            iVar8 = stbi__zlength_extra[uVar10];
            if (a->num_bits < iVar8) {
              stbi__fill_bits(a);
            }
            uVar7 = a->code_buffer;
            a->code_buffer = uVar7 >> ((byte)iVar8 & 0x1f);
            a->num_bits = a->num_bits - iVar8;
            uVar19 = uVar19 + (~(-1 << ((byte)iVar8 & 0x1f)) & uVar7);
          }
          if (a->num_bits < 0x10) {
            stbi__fill_bits(a);
          }
          uVar7 = a->code_buffer;
          uVar11 = (a->z_distance).fast[uVar7 & 0x1ff];
          if (uVar11 == 0) {
            uVar11 = (ushort)uVar7 << 8 | (ushort)uVar7 >> 8;
            uVar16 = (uVar11 & 0xf0f) << 4 | (uVar11 & 0xf0f0) >> 4;
            uVar16 = (uVar16 >> 2 & 0x3333) + (uVar16 & 0x3333) * 4;
            uVar16 = (uVar16 >> 1 & 0x5555) + (uVar16 & 0x5555) * 2;
            lVar22 = 0;
            do {
              lVar13 = lVar22;
              lVar22 = lVar13 + 1;
            } while ((a->z_distance).maxcode[lVar13 + 10] <= (int)uVar16);
            uVar18 = 0xffffffff;
            if (lVar22 != 7) {
              lVar17 = (ulong)(a->z_distance).firstsymbol[lVar13 + 10] +
                       ((ulong)(uVar16 >> (7U - (char)lVar22 & 0x1f)) -
                       (ulong)(a->z_distance).firstcode[lVar13 + 10]);
              if ((ulong)*(byte *)((long)a + lVar17 + 0xc9c) - 9 != lVar22) goto LAB_00157920;
              a->code_buffer = uVar7 >> ((char)lVar13 + 10U & 0x1f);
              a->num_bits = (a->num_bits - (int)lVar22) + -9;
              uVar18 = (uint)*(ushort *)((long)a + lVar17 * 2 + 0xdbc);
            }
          }
          else {
            a->code_buffer = uVar7 >> ((byte)(uVar11 >> 9) & 0x1f);
            a->num_bits = a->num_bits - (uint)(uVar11 >> 9);
            uVar18 = uVar11 & 0x1ff;
          }
          if ((int)uVar18 < 0) goto LAB_0015776b;
          uVar10 = (ulong)uVar18;
          iVar8 = stbi__zdist_base[uVar10];
          if (0xffffffffffffffe5 < uVar10 - 0x1e) {
            iVar20 = stbi__zdist_extra[uVar10];
            if (a->num_bits < iVar20) {
              stbi__fill_bits(a);
            }
            uVar7 = a->code_buffer;
            a->code_buffer = uVar7 >> ((byte)iVar20 & 0x1f);
            a->num_bits = a->num_bits - iVar20;
            iVar8 = iVar8 + (~(-1 << ((byte)iVar20 & 0x1f)) & uVar7);
          }
          if ((long)pcVar9 - (long)a->zout_start < (long)iVar8) {
            *(char **)(in_FS_OFFSET + -0x10) = "bad dist";
LAB_0015775e:
            bVar4 = false;
            uVar12 = 0;
          }
          else {
            if (a->zout_end < pcVar9 + (int)uVar19) {
              iVar20 = stbi__zexpand(a,pcVar9,uVar19);
              if (iVar20 == 0) goto LAB_0015775e;
              pcVar9 = a->zout;
            }
            lVar22 = -(long)iVar8;
            bVar4 = true;
            if (iVar8 == 1) {
              if (uVar19 != 0) {
                memset(pcVar9,(uint)(byte)pcVar9[lVar22],(ulong)uVar19);
                pcVar9 = pcVar9 + (ulong)(uVar19 - 1) + 1;
              }
            }
            else {
              for (; uVar19 != 0; uVar19 = uVar19 - 1) {
                *pcVar9 = pcVar9[lVar22];
                pcVar9 = pcVar9 + 1;
              }
            }
          }
        }
      } while (bVar4);
      if (uVar12 == 0) {
        return 0;
      }
LAB_001578c0:
    } while ((uVar5 & 1) == 0);
    iVar20 = 1;
  }
  else {
    pbVar2 = a->zbuffer;
    uVar12 = 0;
    uVar5 = 0;
    if (pbVar2 < a->zbuffer_end) {
      a->zbuffer = pbVar2 + 1;
      uVar5 = (uint)*pbVar2;
    }
    pbVar2 = a->zbuffer;
    if (pbVar2 < a->zbuffer_end) {
      a->zbuffer = pbVar2 + 1;
      uVar12 = (uint)*pbVar2;
    }
    if ((uVar5 << 8 | uVar12) * -0x42108421 < 0x8421085) {
      if ((uVar12 & 0x20) == 0) {
        if ((uVar5 & 0xf) == 8) goto LAB_00157010;
        pcVar9 = "bad compression";
      }
      else {
        pcVar9 = "no preset dict";
      }
    }
    else {
      pcVar9 = "bad zlib header";
    }
LAB_001578f4:
    *(char **)(in_FS_OFFSET + -0x10) = pcVar9;
LAB_001578fd:
    iVar20 = 0;
  }
switchD_0015708c_caseD_3:
  return iVar20;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}